

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Error(sqlite3 *db,int err_code)

{
  int in_ESI;
  long in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  *(int *)(in_RDI + 0x50) = in_ESI;
  if ((in_ESI == 0) && (*(long *)(in_RDI + 0x188) == 0)) {
    *(undefined4 *)(in_RDI + 0x54) = 0xffffffff;
  }
  else {
    sqlite3ErrorFinish((sqlite3 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Error(sqlite3 *db, int err_code){
  assert( db!=0 );
  db->errCode = err_code;
  if( err_code || db->pErr ){
    sqlite3ErrorFinish(db, err_code);
  }else{
    db->errByteOffset = -1;
  }
}